

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_state_auth_cram_resp(connectdata *conn,int pop3code,pop3state instate)

{
  char cVar1;
  SessionHandle *data;
  CURLcode CVar2;
  char *__s;
  char *local_30;
  size_t local_28;
  
  data = conn->data;
  local_28 = 0;
  local_30 = (char *)0x0;
  if (pop3code == 0x2b) {
    for (__s = (data->state).buffer + 2; (cVar1 = *__s, cVar1 == '\t' || (cVar1 == ' '));
        __s = __s + 1) {
    }
    if (cVar1 != '=') {
      for (local_28 = strlen(__s); local_28 != 0; local_28 = local_28 - 1) {
        if ((0x20 < (ulong)(byte)__s[local_28 - 1]) ||
           ((0x100002600U >> ((ulong)(byte)__s[local_28 - 1] & 0x3f) & 1) == 0)) {
          __s[local_28] = '\0';
          goto LAB_00133a1c;
        }
      }
      local_28 = 0;
    }
LAB_00133a1c:
    CVar2 = Curl_sasl_create_cram_md5_message(data,__s,conn->user,conn->passwd,&local_30,&local_28);
    if (CVar2 == CURLE_OK) {
      if (local_30 == (char *)0x0) {
        CVar2 = CURLE_OK;
      }
      else {
        CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s");
        if (CVar2 == CURLE_OK) {
          (conn->proto).ftpc.count2 = 0xc;
        }
        if (local_30 != (char *)0x0) {
          (*Curl_cfree)(local_30);
        }
      }
    }
  }
  else {
    Curl_failf(data,"Access denied: %d",(ulong)(uint)pop3code);
    CVar2 = CURLE_LOGIN_DENIED;
  }
  return CVar2;
}

Assistant:

static CURLcode pop3_state_auth_cram_resp(struct connectdata *conn,
                                          int pop3code,
                                          pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  char *chlg64 = data->state.buffer;
  size_t len = 0;
  char *rplyb64 = NULL;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Access denied: %d", pop3code);
    return CURLE_LOGIN_DENIED;
  }

  /* Get the challenge */
  for(chlg64 += 2; *chlg64 == ' ' || *chlg64 == '\t'; chlg64++)
    ;

  /* Terminate the challenge */
  if(*chlg64 != '=') {
    for(len = strlen(chlg64); len--;)
      if(chlg64[len] != '\r' && chlg64[len] != '\n' && chlg64[len] != ' ' &&
         chlg64[len] != '\t')
        break;

    if(++len) {
      chlg64[len] = '\0';
    }
  }

  /* Create the response message */
  result = Curl_sasl_create_cram_md5_message(data, chlg64, conn->user,
                                             conn->passwd, &rplyb64, &len);

  /* Send the response */
  if(!result) {
    if(rplyb64) {
      result = Curl_pp_sendf(&conn->proto.pop3c.pp, "%s", rplyb64);

      if(!result)
        state(conn, POP3_AUTH);
    }
    Curl_safefree(rplyb64);
  }

  return result;
}